

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateMembers
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutableStringOneofFieldGenerator *this_local;
  
  PrintExtraFieldInfo(&(this->super_ImmutableStringFieldGenerator).variables_,printer);
  descriptor = FieldDescriptor::file((this->super_ImmutableStringFieldGenerator).descriptor_);
  bVar1 = SupportFieldPresence(descriptor);
  if (bVar1) {
    WriteFieldDocComment(printer,(this->super_ImmutableStringFieldGenerator).descriptor_);
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                      );
  }
  WriteFieldDocComment(printer,(this->super_ImmutableStringFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                     "$deprecation$public java.lang.String get$capitalized_name$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (ref instanceof java.lang.String) {\n    return (java.lang.String) ref;\n  } else {\n    com.google.protobuf.ByteString bs = \n        (com.google.protobuf.ByteString) ref;\n    java.lang.String s = bs.toStringUtf8();\n"
                    );
  bVar1 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                       "    if ($has_oneof_case_message$) {\n      $oneof_name$_ = s;\n    }\n");
  }
  else {
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                       "    if (bs.isValidUtf8() && ($has_oneof_case_message$)) {\n      $oneof_name$_ = s;\n    }\n"
                      );
  }
  io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                     "    return s;\n  }\n}\n");
  WriteFieldDocComment(printer,(this->super_ImmutableStringFieldGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                     "$deprecation$public com.google.protobuf.ByteString\n    get$capitalized_name$Bytes() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (ref instanceof java.lang.String) {\n    com.google.protobuf.ByteString b = \n        com.google.protobuf.ByteString.copyFromUtf8(\n            (java.lang.String) ref);\n    if ($has_oneof_case_message$) {\n      $oneof_name$_ = b;\n    }\n    return b;\n  } else {\n    return (com.google.protobuf.ByteString) ref;\n  }\n}\n"
                    );
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::
GenerateMembers(io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);

  if (SupportFieldPresence(descriptor_->file())) {
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public boolean has$capitalized_name$() {\n"
    "  return $has_oneof_case_message$;\n"
    "}\n");
  }

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.lang.String get$capitalized_name$() {\n"
    "  java.lang.Object ref $default_init$;\n"
    "  if ($has_oneof_case_message$) {\n"
    "    ref = $oneof_name$_;\n"
    "  }\n"
    "  if (ref instanceof java.lang.String) {\n"
    "    return (java.lang.String) ref;\n"
    "  } else {\n"
    "    com.google.protobuf.ByteString bs = \n"
    "        (com.google.protobuf.ByteString) ref;\n"
    "    java.lang.String s = bs.toStringUtf8();\n");
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
    "    if ($has_oneof_case_message$) {\n"
    "      $oneof_name$_ = s;\n"
    "    }\n");
  } else {
    printer->Print(variables_,
    "    if (bs.isValidUtf8() && ($has_oneof_case_message$)) {\n"
    "      $oneof_name$_ = s;\n"
    "    }\n");
  }
  printer->Print(variables_,
    "    return s;\n"
    "  }\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);

  printer->Print(variables_,
    "$deprecation$public com.google.protobuf.ByteString\n"
    "    get$capitalized_name$Bytes() {\n"
    "  java.lang.Object ref $default_init$;\n"
    "  if ($has_oneof_case_message$) {\n"
    "    ref = $oneof_name$_;\n"
    "  }\n"
    "  if (ref instanceof java.lang.String) {\n"
    "    com.google.protobuf.ByteString b = \n"
    "        com.google.protobuf.ByteString.copyFromUtf8(\n"
    "            (java.lang.String) ref);\n"
    "    if ($has_oneof_case_message$) {\n"
    "      $oneof_name$_ = b;\n"
    "    }\n"
    "    return b;\n"
    "  } else {\n"
    "    return (com.google.protobuf.ByteString) ref;\n"
    "  }\n"
    "}\n");
}